

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O2

void test_dict_deflate(Byte *compr,uLong comprLen)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *local_88;
  int local_80;
  Byte *local_70;
  undefined4 local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  uLong local_28;
  
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  uVar1 = deflateInit_(&local_88,9,"1.2.8",0x70);
  if (uVar1 == 0) {
    uVar1 = deflateSetDictionary(&local_88,"hello",6);
    if (uVar1 == 0) {
      dictId = local_28;
      local_68 = (undefined4)comprLen;
      local_88 = hello;
      local_70 = compr;
      sVar3 = strlen(hello);
      local_80 = (int)sVar3 + 1;
      iVar2 = deflate(&local_88,4);
      if (iVar2 != 1) {
        fwrite("deflate should report Z_STREAM_END\n",0x23,1,_stderr);
        goto LAB_00102fa8;
      }
      uVar1 = deflateEnd(&local_88);
      if (uVar1 == 0) {
        return;
      }
      pcVar4 = "deflateEnd";
    }
    else {
      pcVar4 = "deflateSetDictionary";
    }
  }
  else {
    pcVar4 = "deflateInit";
  }
  fprintf(_stderr,"%s error: %d\n",pcVar4,(ulong)uVar1);
LAB_00102fa8:
  exit(1);
}

Assistant:

void test_dict_deflate(compr, comprLen)
    Byte *compr;
    uLong comprLen;
{
    z_stream c_stream; /* compression stream */
    int err;

    c_stream.zalloc = zalloc;
    c_stream.zfree = zfree;
    c_stream.opaque = (voidpf)0;

    err = deflateInit(&c_stream, Z_BEST_COMPRESSION);
    CHECK_ERR(err, "deflateInit");

    err = deflateSetDictionary(&c_stream,
                (const Bytef*)dictionary, (int)sizeof(dictionary));
    CHECK_ERR(err, "deflateSetDictionary");

    dictId = c_stream.adler;
    c_stream.next_out = compr;
    c_stream.avail_out = (uInt)comprLen;

    c_stream.next_in = (z_const unsigned char *)hello;
    c_stream.avail_in = (uInt)strlen(hello)+1;

    err = deflate(&c_stream, Z_FINISH);
    if (err != Z_STREAM_END) {
        fprintf(stderr, "deflate should report Z_STREAM_END\n");
        exit(1);
    }
    err = deflateEnd(&c_stream);
    CHECK_ERR(err, "deflateEnd");
}